

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum
pbrt::ConnectBDPT(Integrator *integrator,SampledWavelengths *lambda,Vertex *lightVertices,
                 Vertex *cameraVertices,int s,int t,LightSamplerHandle lightSampler,
                 CameraHandle camera,SamplerHandle sampler,optional<pbrt::Point2<float>_> *pRaster,
                 Float *misWeightPtr)

{
  Vertex *pVVar1;
  undefined4 uVar2;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 aVar3;
  undefined4 uVar4;
  Normal3<float> args;
  Vertex *pVVar5;
  Interaction *pIVar6;
  Point3fi *pPVar7;
  Point3fi *pPVar8;
  bool bVar9;
  CameraWiSample *pCVar10;
  CameraWiSample *pCVar11;
  CameraWiSample *pCVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  SampledLight *pSVar15;
  SurfaceInteraction *pSVar16;
  long lVar17;
  long lVar18;
  anon_union_248_3_83785cfc_for_Vertex_2 *this;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  sampler_00;
  Normal3f *pNVar19;
  LightSampleContext *this_00;
  Vertex *this_01;
  long in_FS_OFFSET;
  type tVar20;
  Float u;
  undefined1 auVar21 [64];
  undefined1 auVar43 [56];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 extraout_var [60];
  undefined1 auVar42 [64];
  ulong uVar63;
  undefined1 in_ZMM1 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  SampledSpectrum SVar65;
  Point3f args_00;
  SampledSpectrum local_590;
  DispatchSplit<9> local_579;
  Integrator *local_578;
  Vertex *local_570;
  LightSampleContext local_568;
  Vertex *local_538;
  Vertex *local_530;
  CameraHandle local_528;
  undefined4 local_51c;
  Interval<float> local_518;
  Interval<float> IStack_510;
  Interval<float> IStack_508;
  Tuple3<pbrt::Normal3,_float> TStack_500;
  float local_4f4;
  float fStack_4f0;
  float local_4ec;
  optional<pbrt::SampledLight> sampledLight;
  undefined1 local_4c8 [40];
  Tuple3<pbrt::Normal3,_float> aTStack_4a0 [2];
  MediumInterface *local_488;
  MediumHandle MStack_480;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_478;
  SampledSpectrum local_468;
  undefined8 uStack_458;
  undefined8 uStack_450;
  LightSamplerHandle local_448;
  LightSamplerHandle local_440;
  undefined8 local_438;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_430;
  RNG rng;
  optional<pbrt::CameraWiSample> cs;
  SampledSpectrum local_1f8;
  Vertex sampled;
  Interaction local_88;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar64 [56];
  
  auVar64 = in_ZMM1._8_56_;
  auVar43 = ZEXT856(0);
  SampledSpectrum::SampledSpectrum(&local_590,0.0);
  if ((s == 0 || t < 2) || (cameraVertices[(ulong)(uint)t - 1].type != Light)) {
    local_578 = integrator;
    Vertex::Vertex(&sampled);
    local_570 = cameraVertices;
    local_530 = lightVertices;
    if (s == 0) {
      bVar9 = Vertex::IsLight(cameraVertices + (long)t + -1);
      pVVar1 = local_570;
      if (bVar9) {
        SVar65 = Vertex::Le(cameraVertices + (long)t + -1,&local_578->infiniteLights,
                            local_570 + (long)t + -2,lambda);
        auVar49._0_8_ = SVar65.values.values._8_8_;
        auVar49._8_56_ = auVar64;
        auVar27._0_8_ = SVar65.values.values._0_8_;
        auVar27._8_56_ = auVar43;
        rng = (RNG)vmovlhps_avx(auVar27._0_16_,auVar49._0_16_);
        auVar43 = ZEXT856(rng.inc);
        SVar65 = SampledSpectrum::operator*((SampledSpectrum *)&rng,&pVVar1[(long)t + -1].beta);
        auVar50._0_8_ = SVar65.values.values._8_8_;
        auVar50._8_56_ = auVar64;
        auVar28._0_8_ = SVar65.values.values._0_8_;
        auVar28._8_56_ = auVar43;
        local_590.values.values = (array<float,_4>)vmovlhps_avx(auVar28._0_16_,auVar50._0_16_);
      }
    }
    else if (t == 1) {
      bVar9 = Vertex::IsConnectible(lightVertices + (long)s + -1);
      pVVar1 = local_530;
      if (bVar9) {
        pVVar5 = local_530 + (long)s + -1;
        local_538 = lightVertices + (long)s + -1;
        auVar21._0_8_ =
             TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
             ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                         *)sampler.
                           super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                           .bits);
        auVar21._8_56_ = extraout_var_00;
        rng.state = vmovlps_avx(auVar21._0_16_);
        CameraHandle::SampleWi
                  (&cs,(CameraHandle *)
                       camera.
                       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                       .bits,&(pVVar5->field_2).ei.super_Interaction,(Point2f *)&rng,lambda);
        if (cs.set == true) {
          pCVar10 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
          pVVar5 = local_538;
          pstd::optional<pbrt::Point2<float>_>::operator=(pRaster,&pCVar10->pRaster);
          local_528.
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          .bits = *(TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                    *)camera.
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits;
          pCVar10 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
          pCVar11 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
          pCVar12 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
          auVar43 = (undefined1  [56])0x0;
          SVar65 = SampledSpectrum::operator/(&pCVar11->Wi,pCVar12->pdf);
          auVar44._0_8_ = SVar65.values.values._8_8_;
          auVar44._8_56_ = auVar64;
          auVar22._0_8_ = SVar65.values.values._0_8_;
          auVar22._8_56_ = auVar43;
          local_4c8._0_16_ = vmovlhps_avx(auVar22._0_16_,auVar44._0_16_);
          auVar43 = ZEXT856(local_4c8._8_8_);
          Vertex::CreateCamera
                    ((Vertex *)&rng,&local_528,&pCVar10->pLens,(SampledSpectrum *)local_4c8);
          memcpy(&sampled,&rng,0x160);
          SVar65 = Vertex::f(pVVar5,&sampled,Importance);
          auVar45._0_8_ = SVar65.values.values._8_8_;
          auVar45._8_56_ = auVar64;
          auVar23._0_8_ = SVar65.values.values._0_8_;
          auVar23._8_56_ = auVar43;
          local_4c8._0_16_ = vmovlhps_avx(auVar23._0_16_,auVar45._0_16_);
          auVar43 = ZEXT856(local_4c8._8_8_);
          SVar65 = SampledSpectrum::operator*
                             (&pVVar1[(long)s + -1].beta,(SampledSpectrum *)local_4c8);
          auVar46._0_8_ = SVar65.values.values._8_8_;
          auVar46._8_56_ = auVar64;
          auVar24._0_8_ = SVar65.values.values._0_8_;
          auVar24._8_56_ = auVar43;
          rng = (RNG)vmovlhps_avx(auVar24._0_16_,auVar46._0_16_);
          auVar43 = ZEXT856(rng.inc);
          SVar65 = SampledSpectrum::operator*((SampledSpectrum *)&rng,&sampled.beta);
          auVar47._0_8_ = SVar65.values.values._8_8_;
          auVar47._8_56_ = auVar64;
          auVar25._0_8_ = SVar65.values.values._0_8_;
          auVar25._8_56_ = auVar43;
          local_590.values.values = (array<float,_4>)vmovlhps_avx(auVar25._0_16_,auVar47._0_16_);
          bVar9 = Vertex::IsOnSurface(pVVar5);
          if (bVar9) {
            pCVar10 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
            pNVar19 = &(pVVar5->field_2).ei.super_Interaction.n;
            if (pVVar5->type == Surface) {
              pNVar19 = (Normal3f *)((pVVar5->field_2).mi.sigma_maj.values.values + 2);
            }
            tVar20 = AbsDot<float>(&pCVar10->wi,pNVar19);
            SampledSpectrum::operator*=(&local_590,tVar20);
          }
          bVar9 = SampledSpectrum::operator_cast_to_bool(&local_590);
          uVar63 = auVar64._0_8_;
          if (bVar9) {
            pCVar10 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
            uVar13 = Hash<pbrt::Point2<float>>
                               ((Point2<float>)(pCVar10->pRaster).super_Tuple2<pbrt::Point2,_float>)
            ;
            pCVar10 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
            local_88.mediumInterface = (pCVar10->pLens).mediumInterface;
            local_88.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
                 (pCVar10->pLens).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
            local_88.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y =
                 (pCVar10->pLens).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
            local_88.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
                 (pCVar10->pLens).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
            local_88.time = (pCVar10->pLens).time;
            local_88.wo.super_Tuple3<pbrt::Vector3,_float>.x =
                 (pCVar10->pLens).wo.super_Tuple3<pbrt::Vector3,_float>.x;
            local_88.wo.super_Tuple3<pbrt::Vector3,_float>.y =
                 (pCVar10->pLens).wo.super_Tuple3<pbrt::Vector3,_float>.y;
            local_88.wo.super_Tuple3<pbrt::Vector3,_float>.z =
                 (pCVar10->pLens).wo.super_Tuple3<pbrt::Vector3,_float>.z;
            local_88.n.super_Tuple3<pbrt::Normal3,_float>.x =
                 (pCVar10->pLens).n.super_Tuple3<pbrt::Normal3,_float>.x;
            local_88.n.super_Tuple3<pbrt::Normal3,_float>.y =
                 (pCVar10->pLens).n.super_Tuple3<pbrt::Normal3,_float>.y;
            local_88._48_8_ =
                 *(undefined8 *)&(pCVar10->pLens).n.super_Tuple3<pbrt::Normal3,_float>.z;
            local_88._56_8_ =
                 *(undefined8 *)&(pCVar10->pLens).uv.super_Tuple2<pbrt::Point2,_float>.y;
            local_88.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     )(pCVar10->pLens).medium.
                      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                      .bits;
            auVar43 = ZEXT856((ulong)local_88.pi.super_Point3<pbrt::Interval<float>_>.
                                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
            auVar64 = ZEXT856(uVar63);
            uVar14 = Hash<pbrt::Interaction>(&local_88);
            RNG::SetSequence(&rng,uVar13,uVar14);
            pCVar10 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
            pCVar11 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
            SVar65 = Integrator::Tr(local_578,&pCVar10->pRef,&pCVar11->pLens,lambda,&rng);
            auVar48._0_8_ = SVar65.values.values._8_8_;
            auVar48._8_56_ = auVar64;
            auVar26._0_8_ = SVar65.values.values._0_8_;
            auVar26._8_56_ = auVar43;
            local_4c8._0_16_ = vmovlhps_avx(auVar26._0_16_,auVar48._0_16_);
            SampledSpectrum::operator*=(&local_590,(SampledSpectrum *)local_4c8);
          }
        }
        pstd::optional<pbrt::CameraWiSample>::~optional(&cs);
      }
    }
    else if (s == 1) {
      pVVar1 = cameraVertices + (long)t + -1;
      bVar9 = Vertex::IsConnectible(pVVar1);
      if (bVar9) {
        u = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
            ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                      ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                        *)sampler.
                          super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                          .bits);
        LightSamplerHandle::Sample
                  (&sampledLight,
                   (LightSamplerHandle *)
                   lightSampler.
                   super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                   .bits,u);
        if (sampledLight.set == true) {
          pSVar15 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
          aVar3.camera.
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          .bits = (CameraHandle)
                  (pSVar15->light).
                  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                  .bits;
          pSVar15 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
          pVVar5 = local_570;
          local_538 = (Vertex *)CONCAT44(local_538._4_4_,pSVar15->pdf);
          bVar9 = Vertex::IsOnSurface(pVVar1);
          this = &pVVar5[(long)t + -1].field_2;
          if (bVar9) {
            pSVar16 = Interaction::AsSurface(&(this->ei).super_Interaction);
            local_568.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
                 (pSVar16->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
            pIVar6 = &pSVar16->super_Interaction;
            local_568.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low =
                 (pIVar6->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
            local_568.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
                 (pIVar6->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
            local_568.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
                 (pIVar6->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
            local_568.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
                 (pIVar6->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
            pPVar7 = &(pSVar16->super_Interaction).pi;
            pPVar8 = &(pSVar16->super_Interaction).pi;
            rng.state._0_4_ =
                 (pPVar7->super_Point3<pbrt::Interval<float>_>).
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
            rng.state._4_4_ =
                 (pPVar7->super_Point3<pbrt::Interval<float>_>).
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
            rng.inc._0_4_ =
                 (pPVar8->super_Point3<pbrt::Interval<float>_>).
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
            rng.inc._4_4_ =
                 (pPVar8->super_Point3<pbrt::Interval<float>_>).
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
            local_568.n.super_Tuple3<pbrt::Normal3,_float>.z =
                 (pSVar16->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
            local_568.n.super_Tuple3<pbrt::Normal3,_float>.x =
                 (pSVar16->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
            local_568.n.super_Tuple3<pbrt::Normal3,_float>.y =
                 (pSVar16->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
            uVar2 = (pSVar16->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
            uVar4 = (pSVar16->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
            local_568.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                 (pSVar16->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
            local_568.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar2;
            local_568.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar4;
          }
          else {
            local_568.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
                 pVVar5[(long)t + -1].field_2.ei.super_Interaction.pi.
                 super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
            local_568.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = *(undefined1 (*) [16])this;
            rng = *(RNG *)this;
            local_568.ns.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
            local_568.ns.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
            local_568.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
            local_568.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
            local_568.n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
            local_568.ns.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
          }
          IStack_508 = local_568.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          TStack_500.x = local_568.n.super_Tuple3<pbrt::Normal3,_float>.x;
          TStack_500.y = local_568.n.super_Tuple3<pbrt::Normal3,_float>.y;
          TStack_500.z = local_568.n.super_Tuple3<pbrt::Normal3,_float>.z;
          local_4f4 = local_568.ns.super_Tuple3<pbrt::Normal3,_float>.x;
          fStack_4f0 = local_568.ns.super_Tuple3<pbrt::Normal3,_float>.y;
          local_4ec = local_568.ns.super_Tuple3<pbrt::Normal3,_float>.z;
          local_518 = local_568.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          IStack_510 = local_568.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          auVar35._0_8_ =
               TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                           *)sampler.
                             super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                             .bits);
          auVar35._8_56_ = extraout_var_01;
          local_4c8._24_8_ = &local_51c;
          local_468.values.values = *(array<float,_4> *)(lambda->lambda).values;
          uStack_458 = *(undefined8 *)(lambda->pdf).values;
          uStack_450 = *(undefined8 *)((lambda->pdf).values + 2);
          local_4c8._16_8_ = &local_468;
          local_4c8._8_8_ = &local_438;
          local_4c8._0_8_ = &rng;
          local_438 = vmovlps_avx(auVar35._0_16_);
          local_51c = 1;
          rng.inc._0_4_ = IStack_510.low;
          rng.inc._4_4_ = IStack_510.high;
          rng.state._0_4_ = local_518.low;
          rng.state._4_4_ = local_518.high;
          local_430.camera.
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          .bits = aVar3.camera.
                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  .bits;
          detail::DispatchSplit<9>::operator()(&cs,&local_579,&local_430,(ulong)aVar3 >> 0x30);
          auVar64 = ZEXT856(0);
          if (0.0 < (float)cs.optionalValue._28_4_) {
            local_4c8._8_8_ = cs.optionalValue._48_8_;
            local_4c8._0_8_ = cs.optionalValue._40_8_;
            local_4c8._16_8_ = cs.optionalValue._56_8_;
            local_4c8._24_8_ = cs.optionalValue._64_8_;
            local_4c8._32_8_ = cs.optionalValue._72_8_;
            aTStack_4a0[0].x = (float)cs.optionalValue._80_4_;
            aTStack_4a0[0].y = (float)cs.optionalValue._84_4_;
            aTStack_4a0[0].z = (float)cs.optionalValue._88_4_;
            aTStack_4a0[1].x = (float)cs.optionalValue._92_4_;
            aTStack_4a0[1].y = (float)cs.optionalValue._96_4_;
            aTStack_4a0[1].z = (float)cs.optionalValue._100_4_;
            local_488 = (MediumInterface *)cs.optionalValue._104_8_;
            MStack_480.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                       )cs.optionalValue._112_8_;
            auVar43 = (undefined1  [56])0x0;
            auVar64 = ZEXT856((ulong)cs.optionalValue._112_8_);
            local_478.camera.
            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
            .bits = aVar3.camera.
                    super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                    .bits;
            SVar65 = SampledSpectrum::operator/
                               ((SampledSpectrum *)&cs,
                                (float)cs.optionalValue._28_4_ * local_538._0_4_);
            auVar57._0_8_ = SVar65.values.values._8_8_;
            auVar57._8_56_ = auVar64;
            auVar36._0_8_ = SVar65.values.values._0_8_;
            auVar36._8_56_ = auVar43;
            local_468.values.values = (array<float,_4>)vmovlhps_avx(auVar36._0_16_,auVar57._0_16_);
            Vertex::CreateLight((Vertex *)&rng,(EndpointInteraction *)local_4c8,&local_468,0.0);
            memcpy(&sampled,&rng,0x160);
            local_440.
            super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
            .bits = *(TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                      *)lightSampler.
                        super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                        .bits;
            sampled.pdfFwd =
                 Vertex::PdfLightOrigin(&sampled,&local_578->infiniteLights,pVVar1,&local_440);
            auVar43 = extraout_var_02;
            SVar65 = Vertex::f(pVVar1,&sampled,Radiance);
            auVar58._0_8_ = SVar65.values.values._8_8_;
            auVar58._8_56_ = auVar64;
            auVar37._0_8_ = SVar65.values.values._0_8_;
            auVar37._8_56_ = auVar43;
            local_468.values.values = (array<float,_4>)vmovlhps_avx(auVar37._0_16_,auVar58._0_16_);
            auVar43 = ZEXT856(local_468.values.values._8_8_);
            SVar65 = SampledSpectrum::operator*(&pVVar5[(long)t + -1].beta,&local_468);
            auVar59._0_8_ = SVar65.values.values._8_8_;
            auVar59._8_56_ = auVar64;
            auVar38._0_8_ = SVar65.values.values._0_8_;
            auVar38._8_56_ = auVar43;
            rng = (RNG)vmovlhps_avx(auVar38._0_16_,auVar59._0_16_);
            auVar43 = ZEXT856(rng.inc);
            SVar65 = SampledSpectrum::operator*((SampledSpectrum *)&rng,&sampled.beta);
            auVar60._0_8_ = SVar65.values.values._8_8_;
            auVar60._8_56_ = auVar64;
            auVar39._0_8_ = SVar65.values.values._0_8_;
            auVar39._8_56_ = auVar43;
            local_590.values.values = (array<float,_4>)vmovlhps_avx(auVar39._0_16_,auVar60._0_16_);
            bVar9 = Vertex::IsOnSurface(pVVar1);
            if (bVar9) {
              pNVar19 = &(pVVar1->field_2).ei.super_Interaction.n;
              if (pVVar1->type == Surface) {
                pNVar19 = (Normal3f *)((pVVar1->field_2).mi.sigma_maj.values.values + 2);
              }
              tVar20 = AbsDot<float>((Vector3<float> *)((long)&cs.optionalValue + 0x10),pNVar19);
              SampledSpectrum::operator*=(&local_590,tVar20);
            }
            bVar9 = SampledSpectrum::operator_cast_to_bool(&local_590);
            if (bVar9) {
              this_00 = &local_568;
              args_00 = LightSampleContext::p(this_00);
              uVar13 = Hash<pbrt::Point3<float>>
                                 ((pbrt *)this_00,
                                  (Point3<float>)args_00.super_Tuple3<pbrt::Point3,_float>);
              args.super_Tuple3<pbrt::Normal3,_float>.z =
                   local_568.n.super_Tuple3<pbrt::Normal3,_float>.z;
              args.super_Tuple3<pbrt::Normal3,_float>.x =
                   local_568.n.super_Tuple3<pbrt::Normal3,_float>.x;
              args.super_Tuple3<pbrt::Normal3,_float>.y =
                   local_568.n.super_Tuple3<pbrt::Normal3,_float>.y;
              auVar64 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
              auVar43 = (undefined1  [56])0x0;
              uVar14 = Hash<pbrt::Normal3<float>>((pbrt *)this_00,args);
              RNG::SetSequence(&rng,uVar13,uVar14);
              SVar65 = Integrator::Tr(local_578,&(this->ei).super_Interaction,
                                      (Interaction *)((long)&cs.optionalValue + 0x28),lambda,&rng);
              auVar61._0_8_ = SVar65.values.values._8_8_;
              auVar61._8_56_ = auVar64;
              auVar40._0_8_ = SVar65.values.values._0_8_;
              auVar40._8_56_ = auVar43;
              local_468.values.values = (array<float,_4>)vmovlhps_avx(auVar40._0_16_,auVar61._0_16_)
              ;
              SampledSpectrum::operator*=(&local_590,&local_468);
            }
          }
        }
        pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
      }
    }
    else {
      pVVar1 = lightVertices + (long)s + -1;
      bVar9 = Vertex::IsConnectible(pVVar1);
      pVVar5 = local_570;
      if (bVar9) {
        this_01 = local_570 + (long)t + -1;
        bVar9 = Vertex::IsConnectible(this_01);
        if (bVar9) {
          SVar65 = Vertex::f(pVVar1,this_01,Importance);
          auVar51._0_8_ = SVar65.values.values._8_8_;
          auVar51._8_56_ = auVar64;
          auVar29._0_8_ = SVar65.values.values._0_8_;
          auVar29._8_56_ = auVar43;
          local_4c8._0_16_ = vmovlhps_avx(auVar29._0_16_,auVar51._0_16_);
          auVar43 = ZEXT856(local_4c8._8_8_);
          SVar65 = SampledSpectrum::operator*
                             (&lightVertices[(long)s + -1].beta,(SampledSpectrum *)local_4c8);
          auVar52._0_8_ = SVar65.values.values._8_8_;
          auVar52._8_56_ = auVar64;
          auVar30._0_8_ = SVar65.values.values._0_8_;
          auVar30._8_56_ = auVar43;
          cs.optionalValue._0_16_ = vmovlhps_avx(auVar30._0_16_,auVar52._0_16_);
          auVar43 = ZEXT856(cs.optionalValue._8_8_);
          SVar65 = Vertex::f(this_01,pVVar1,Radiance);
          auVar53._0_8_ = SVar65.values.values._8_8_;
          auVar53._8_56_ = auVar64;
          auVar31._0_8_ = SVar65.values.values._0_8_;
          auVar31._8_56_ = auVar43;
          local_568.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
               vmovlhps_avx(auVar31._0_16_,auVar53._0_16_);
          auVar43 = ZEXT856(local_568.pi.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
          SVar65 = SampledSpectrum::operator*((SampledSpectrum *)&cs,(SampledSpectrum *)&local_568);
          auVar54._0_8_ = SVar65.values.values._8_8_;
          auVar54._8_56_ = auVar64;
          auVar32._0_8_ = SVar65.values.values._0_8_;
          auVar32._8_56_ = auVar43;
          rng = (RNG)vmovlhps_avx(auVar32._0_16_,auVar54._0_16_);
          auVar43 = ZEXT856(rng.inc);
          sampler_00.bits = (uintptr_t)&pVVar5[(long)t + -1].beta;
          SVar65 = SampledSpectrum::operator*
                             ((SampledSpectrum *)&rng,(SampledSpectrum *)sampler_00.bits);
          auVar55._0_8_ = SVar65.values.values._8_8_;
          auVar55._8_56_ = auVar64;
          auVar33._0_8_ = SVar65.values.values._0_8_;
          auVar33._8_56_ = auVar43;
          local_590.values.values = (array<float,_4>)vmovlhps_avx(auVar33._0_16_,auVar55._0_16_);
          auVar43 = ZEXT856(local_590.values.values._8_8_);
          bVar9 = SampledSpectrum::operator_cast_to_bool(&local_590);
          if (bVar9) {
            SVar65 = G(local_578,(SamplerHandle)sampler_00.bits,pVVar1,this_01,lambda);
            auVar56._0_8_ = SVar65.values.values._8_8_;
            auVar56._8_56_ = auVar64;
            auVar34._0_8_ = SVar65.values.values._0_8_;
            auVar34._8_56_ = auVar43;
            rng = (RNG)vmovlhps_avx(auVar34._0_16_,auVar56._0_16_);
            SampledSpectrum::operator*=(&local_590,(SampledSpectrum *)&rng);
          }
        }
      }
    }
    *(long *)(in_FS_OFFSET + -0x2b8) = *(long *)(in_FS_OFFSET + -0x2b8) + 1;
    bVar9 = SampledSpectrum::operator_cast_to_bool(&local_590);
    if (!bVar9) {
      *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
    }
    *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
    lVar17 = (long)(s + -2 + t);
    *(long *)(in_FS_OFFSET + -0x2a8) = *(long *)(in_FS_OFFSET + -0x2a8) + lVar17;
    lVar18 = *(long *)(in_FS_OFFSET + -0x720);
    if (lVar17 <= *(long *)(in_FS_OFFSET + -0x720)) {
      lVar18 = lVar17;
    }
    if (lVar17 < *(long *)(in_FS_OFFSET + -0x718)) {
      lVar17 = *(long *)(in_FS_OFFSET + -0x718);
    }
    *(long *)(in_FS_OFFSET + -0x720) = lVar18;
    *(long *)(in_FS_OFFSET + -0x718) = lVar17;
    bVar9 = SampledSpectrum::operator_cast_to_bool(&local_590);
    auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
    if (bVar9) {
      local_448.
      super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
      .bits = *(TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                *)lightSampler.
                  super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                  .bits;
      auVar41._0_4_ = MISWeight(local_578,local_530,local_570,&sampled,s,t,&local_448);
      auVar41._4_60_ = extraout_var;
    }
    auVar43 = auVar41._8_56_;
    local_570 = (Vertex *)CONCAT44(local_570._4_4_,auVar41._0_4_);
    SampledSpectrum::operator*=(&local_590,auVar41._0_4_);
    if (misWeightPtr != (Float *)0x0) {
      auVar43 = (undefined1  [56])0x0;
      *misWeightPtr = local_570._0_4_;
    }
    SVar65 = SampledWavelengths::PDF(lambda);
    auVar62._0_8_ = SVar65.values.values._8_8_;
    auVar62._8_56_ = auVar64;
    auVar42._0_8_ = SVar65.values.values._0_8_;
    auVar42._8_56_ = auVar43;
    rng = (RNG)vmovlhps_avx(auVar42._0_16_,auVar62._0_16_);
    local_1f8 = SafeDiv(&local_590,(SampledSpectrum *)&rng);
  }
  else {
    SampledSpectrum::SampledSpectrum(&local_1f8,0.0);
  }
  return (array<float,_4>)(array<float,_4>)local_1f8;
}

Assistant:

SampledSpectrum ConnectBDPT(const Integrator &integrator, SampledWavelengths &lambda,
                            Vertex *lightVertices, Vertex *cameraVertices, int s, int t,
                            LightSamplerHandle lightSampler, CameraHandle camera,
                            SamplerHandle sampler, pstd::optional<Point2f> *pRaster,
                            Float *misWeightPtr) {
    SampledSpectrum L(0.f);
    // Ignore invalid connections related to infinite area lights
    if (t > 1 && s != 0 && cameraVertices[t - 1].type == VertexType::Light)
        return SampledSpectrum(0.f);

    // Perform connection and write contribution to _L_
    Vertex sampled;
    if (s == 0) {
        // Interpret the camera subpath as a complete path
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsLight())
            L = pt.Le(integrator.infiniteLights, cameraVertices[t - 2], lambda) * pt.beta;
        DCHECK(!L.HasNaNs());

    } else if (t == 1) {
        // Sample a point on the camera and connect it to the light subpath
        const Vertex &qs = lightVertices[s - 1];
        if (qs.IsConnectible()) {
            pstd::optional<CameraWiSample> cs =
                camera.SampleWi(qs.GetInteraction(), sampler.Get2D(), lambda);
            if (cs) {
                *pRaster = cs->pRaster;
                // Initialize dynamically sampled vertex and _L_ for $t=1$ case
                sampled = Vertex::CreateCamera(camera, cs->pLens, cs->Wi / cs->pdf);
                L = qs.beta * qs.f(sampled, TransportMode::Importance) * sampled.beta;
                if (qs.IsOnSurface())
                    L *= AbsDot(cs->wi, qs.ns());
                DCHECK(!L.HasNaNs());
                // Only check visibility after we know that the path would
                // make a non-zero contribution.
                if (L) {
                    RNG rng(Hash(cs->pRaster), Hash(cs->pLens));
                    L *= integrator.Tr(cs->pRef, cs->pLens, lambda, rng);
                }
            }
        }

    } else if (s == 1) {
        // Sample a point on a light and connect it to the camera subpath
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsConnectible()) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());

            if (sampledLight) {
                LightHandle light = sampledLight->light;
                Float lightPDF = sampledLight->pdf;

                LightSampleContext ctx;
                if (pt.IsOnSurface())
                    ctx = LightSampleContext(pt.GetInteraction().AsSurface());
                else
                    ctx = LightSampleContext(pt.GetInteraction());
                LightLiSample lightWeight = light.SampleLi(ctx, sampler.Get2D(), lambda);
                if (lightWeight) {
                    EndpointInteraction ei(lightWeight.pLight, light);
                    sampled = Vertex::CreateLight(
                        ei, lightWeight.L / (lightWeight.pdf * lightPDF), 0);
                    sampled.pdfFwd = sampled.PdfLightOrigin(integrator.infiniteLights, pt,
                                                            lightSampler);
                    L = pt.beta * pt.f(sampled, TransportMode::Radiance) * sampled.beta;
                    if (pt.IsOnSurface())
                        L *= AbsDot(lightWeight.wi, pt.ns());
                    // Only check visibility if the path would carry radiance.
                    if (L) {
                        RNG rng(Hash(ctx.p()), Hash(ctx.n));
                        L *= integrator.Tr(pt.GetInteraction(), lightWeight.pLight,
                                           lambda, rng);
                    }
                }
            }
        }

    } else {
        // Handle all other bidirectional connection cases
        const Vertex &qs = lightVertices[s - 1], &pt = cameraVertices[t - 1];
        if (qs.IsConnectible() && pt.IsConnectible()) {
            L = qs.beta * qs.f(pt, TransportMode::Importance) *
                pt.f(qs, TransportMode::Radiance) * pt.beta;
            PBRT_DBG("%s\n",
                     StringPrintf(
                         "General connect s: %d, t: %d, qs: %s, pt: %s, qs.f(pt): %s, "
                         "pt.f(qs): %s, G: %s, dist^2: %f",
                         s, t, qs, pt, qs.f(pt, TransportMode::Importance),
                         pt.f(qs, TransportMode::Radiance),
                         G(integrator, sampler, qs, pt, lambda),
                         DistanceSquared(qs.p(), pt.p()))
                         .c_str());
            if (L)
                L *= G(integrator, sampler, qs, pt, lambda);
        }
    }

    ++totalPaths;
    if (!L)
        ++zeroRadiancePaths;
    ReportValue(pathLength, s + t - 2);
    // Compute MIS weight for connection strategy
    Float misWeight = L ? MISWeight(integrator, lightVertices, cameraVertices, sampled, s,
                                    t, lightSampler)
                        : 0.f;
    PBRT_DBG("MIS weight for (s,t) = (%d, %d) connection: %f\n", s, t, misWeight);
    DCHECK(!IsNaN(misWeight));
    L *= misWeight;
    if (misWeightPtr != nullptr)
        *misWeightPtr = misWeight;

    return SafeDiv(L, lambda.PDF());
}